

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O0

void write_iteration_info(double mu,double p_rho,double eta,uint global_iteration)

{
  char acStack_20068 [8];
  char info [131072];
  char filename [64];
  uint global_iteration_local;
  double eta_local;
  double p_rho_local;
  double mu_local;
  
  memset(info + 0x1fff8,0,0x40);
  snprintf(info + 0x1fff8,0x40,"results/dat/%u/info",(ulong)global_iteration);
  snprintf(acStack_20068,0x20000,"mu value: %.le\np_rho value: %.le\neta value: %.le\n     ",mu,
           p_rho,eta);
  rewrite_file(info + 0x1fff8,acStack_20068);
  return;
}

Assistant:

void write_iteration_info (double mu, double p_rho, double eta, unsigned global_iteration) {
  char filename[MAX_FILENAME_SIZE] = "";
  char info[MAX_BUFFER_SIZE];

  snprintf (filename, MAX_FILENAME_SIZE, "results/dat/%u/info", global_iteration);
  snprintf (info, MAX_BUFFER_SIZE, 
    "mu value: %.le\n\
p_rho value: %.le\n\
eta value: %.le\n\
     ",
     mu,
     p_rho,
     eta);

  rewrite_file (filename, info);
}